

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# critbit.c
# Opt level: O0

void cb_free_node(void *ptr)

{
  critbit_node *__ptr;
  int iVar1;
  critbit_node *node;
  void *ptr_local;
  
  node = (critbit_node *)ptr;
  iVar1 = decode_pointer(&node);
  __ptr = node;
  if (iVar1 == 1) {
    cb_free_node(node->child[0]);
    cb_free_node(__ptr->child[1]);
    free(__ptr);
  }
  else {
    free(node);
  }
  return;
}

Assistant:

static void cb_free_node(void * ptr)
{
    if (decode_pointer(&ptr) == INTERNAL_NODE) {
        struct critbit_node * node = (struct critbit_node *)ptr;
        cb_free_node(node->child[0]);
        cb_free_node(node->child[1]);
        free(node);
    }
    else {
        free(ptr);
    }
}